

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool __thiscall
wallet::MockableBatch::WriteKey
          (MockableBatch *this,DataStream *key,DataStream *value,bool overwrite)

{
  byte bVar1;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_bool>
  pVar2;
  SerializeData value_data;
  SerializeData key_data;
  allocator_type local_59;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_58;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pass == true) {
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::
    vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_40,
               (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                )((key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                  _M_impl.super__Vector_impl_data._M_start + key->m_read_pos),
               (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                )(key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_58);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::
    vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_58,
               (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                )((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                  _M_impl.super__Vector_impl_data._M_start + value->m_read_pos),
               (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                )(value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_59);
    pVar2 = std::
            _Rb_tree<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::_Select1st<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
            ::
            _M_emplace_unique<std::vector<std::byte,zero_after_free_allocator<std::byte>>&,std::vector<std::byte,zero_after_free_allocator<std::byte>>&>
                      ((_Rb_tree<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::_Select1st<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
                        *)this->m_records,
                       (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_40,
                       (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
    bVar1 = pVar2.second;
    if (((~overwrite | bVar1) & 1) == 0) {
      bVar1 = 1;
      std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::operator=
                ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                 &pVar2.first._M_node._M_node[1]._M_right,
                 (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
    }
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_58);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_40);
  }
  else {
    bVar1 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool MockableBatch::WriteKey(DataStream&& key, DataStream&& value, bool overwrite)
{
    if (!m_pass) {
        return false;
    }
    SerializeData key_data{key.begin(), key.end()};
    SerializeData value_data{value.begin(), value.end()};
    auto [it, inserted] = m_records.emplace(key_data, value_data);
    if (!inserted && overwrite) { // Overwrite if requested
        it->second = value_data;
        inserted = true;
    }
    return inserted;
}